

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ZeroSlopeTestCase::testPolygonOffset
          (ZeroSlopeTestCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  RenderContext *pRVar2;
  TestContext *testCtx;
  ZeroSlopeTestCase *pZVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar7;
  allocator<char> local_332;
  allocator<char> local_331;
  ZeroSlopeTestCase *local_330;
  Surface referenceImage;
  Surface testImage;
  float local_2f8 [12];
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [384];
  ShaderProgram program;
  
  local_2f8[0] = -0.4;
  local_2f8[1] = 0.4;
  local_2f8[2] = 0.0;
  local_2f8[3] = 1.0;
  local_2f8[4] = -0.8;
  local_2f8[5] = -0.5;
  local_2f8[6] = 0.0;
  local_2f8[7] = 1.0;
  local_2f8[8] = 0.7;
  local_2f8[9] = 0.2;
  local_2f8[10] = 0.0;
  local_2f8[0xb] = 1.0;
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&testImage,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&referenceImage,iVar4,iVar4);
  poVar1 = (ostringstream *)(local_288 + 8);
  local_288._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  local_330 = this;
  std::operator<<((ostream *)poVar1,"Setup triangle with coordinates:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_288 + 8);
  for (lVar7 = 0xc; pZVar3 = local_330, lVar7 != 0x3c; lVar7 = lVar7 + 0x10) {
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tx=");
    std::ostream::operator<<(poVar1,*(float *)((long)&testImage.m_pixels.m_ptr + lVar7 + 4));
    std::operator<<((ostream *)poVar1,"\ty=");
    std::ostream::operator<<(poVar1,*(float *)((long)&testImage.m_pixels.m_cap + lVar7));
    std::operator<<((ostream *)poVar1,"\tz=");
    std::ostream::operator<<(poVar1,*(float *)((long)&testImage.m_pixels.m_cap + lVar7 + 4));
    std::operator<<((ostream *)poVar1,"\tw=");
    std::ostream::operator<<(poVar1,*(float *)((long)local_2f8 + lVar7));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  iVar4 = (*((local_330->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pRVar2 = ((pZVar3->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_331);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "#version 300 es\nin highp vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,&local_332);
  glu::makeVtxFragSources((ProgramSources *)local_288,&local_2a8,&local_2c8);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)local_288);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_288);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  uVar5 = (**(code **)(lVar7 + 0x780))(program.m_program.m_program,"a_position");
  uVar6 = (**(code **)(lVar7 + 0x780))(program.m_program.m_program,"a_color");
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar7 + 0x1d0))(0x3f800000);
    (**(code **)(lVar7 + 0x188))(0x4100);
    (**(code **)(lVar7 + 0x1a00))(0,0,(local_330->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar7 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar7 + 0x5e0))(0xb71);
    (**(code **)(lVar7 + 0x5e0))(0x8037);
    (**(code **)(lVar7 + 0x610))(uVar5);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x19f0))(uVar5,4,0x1406,0,0,local_2f8);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw triangle. Color = Red.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0).");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x4a0))(0x207);
    (**(code **)(lVar7 + 0x1028))(0,0);
    (**(code **)(lVar7 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Draw triangle. Color = Black.\tState: DepthFunc = EQUAL, PolygonOffset(4, 0).")
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar7 + 0x4a0))(0x202);
    (**(code **)(lVar7 + 0x1028))(0x40800000,0);
    (**(code **)(lVar7 + 0x1858))(0,0,0,0x3f800000,uVar6);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    (**(code **)(lVar7 + 0x518))(uVar5);
    (**(code **)(lVar7 + 0x1680))(0);
    (**(code **)(lVar7 + 0x648))();
    pZVar3 = local_330;
    pRVar2 = ((local_330->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&testImage);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_288);
    glu::ShaderProgram::~ShaderProgram(&program);
    poVar1 = (ostringstream *)(local_288 + 8);
    local_288._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Expecting black triangle.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&referenceImage);
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_288,(Vec4 *)&program);
    testCtx = (pZVar3->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar2 = ((pZVar3->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_288,&testImage);
    tcu::Surface::getAccess((PixelBufferAccess *)&program,&referenceImage);
    verifyImages((TestLog *)log,testCtx,pRVar2,(ConstPixelBufferAccess *)local_288,
                 (ConstPixelBufferAccess *)&program);
    tcu::Surface::~Surface(&referenceImage);
    tcu::Surface::~Surface(&testImage);
    return;
  }
  glu::operator<<((TestLog *)log,&program);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPolygonOffsetTests.cpp"
             ,0x3ed);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ZeroSlopeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[] =
	{
		tcu::Vec4(-0.4f,  0.4f, 0.0f, 1.0f),
		tcu::Vec4(-0.8f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.7f,  0.2f, 0.0f, 1.0f),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// log the triangle
	log << TestLog::Message << "Setup triangle with coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangle); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangle[ndx].x()
				<< "\ty=" << triangle[ndx].y()
				<< "\tz=" << triangle[ndx].z()
				<< "\tw=" << triangle[ndx].w()
				<< TestLog::EndMessage;

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

			log << TestLog::Message << "Draw triangle. Color = Red.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw triangle. Color = Black.\tState: DepthFunc = EQUAL, PolygonOffset(4, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_EQUAL);
			gl.polygonOffset			(4, 0);	// triangle slope == 0
			gl.vertexAttrib4f			(colorLoc, 0.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black triangle." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}